

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<9,_10,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  float local_80 [2];
  Vector<float,_3> res;
  float local_68 [2];
  Vector<float,_3> res_1;
  undefined8 local_50;
  float local_48;
  undefined8 local_44;
  float local_3c;
  undefined8 uStack_38;
  Type in0;
  
  puVar2 = &uStack_38;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x30);
      lVar5 = lVar5 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    uStack_38 = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data[0] = (float)*(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    in0.m_data.m_data[0].m_data[3] = (float)((ulong)*(undefined8 *)evalCtx->in[1].m_data >> 0x20);
    in0.m_data.m_data[1].m_data[0] = (float)uVar1;
    in0.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
    in0.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[3] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    uStack_38 = 0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    puVar4 = &s_constInMat3x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)((long)puVar2 + lVar5 * 4) = *(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  local_44 = uStack_38;
  local_3c = in0.m_data.m_data[0].m_data[0];
  local_50 = CONCAT44(in0.m_data.m_data[1].m_data[0],in0.m_data.m_data[0].m_data[3]);
  local_48 = in0.m_data.m_data[1].m_data[1];
  res.m_data._0_8_ = res.m_data._0_8_ & 0xffffffff00000000;
  lVar3 = 0;
  do {
    res.m_data[lVar3 + -2] =
         *(float *)((long)&local_44 + lVar3 * 4) + *(float *)((long)&local_50 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_1.m_data[1] = in0.m_data.m_data[2].m_data[0];
  res_1.m_data[2] = in0.m_data.m_data[2].m_data[1];
  res_1.m_data[0] = 0.0;
  lVar3 = 0;
  do {
    res_1.m_data[lVar3 + -2] = res.m_data[lVar3 + -2] + res_1.m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res.m_data[0] = 0.0;
  res.m_data[1] = 1.4013e-45;
  res.m_data[2] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)res.m_data[lVar3 + -2]] = res.m_data[lVar3 + 2];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}